

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__3,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 *local_28;
  code *local_20;
  undefined1 *local_18;
  code *local_10;
  
  local_18 = (undefined1 *)&local_68;
  local_60 = *(undefined8 *)(*(long *)(**(long **)this + 8) + 0x20);
  local_68 = *(undefined8 *)(*(long *)(**(long **)this + 8) + 0x28);
  local_28 = &local_58;
  local_58 = 5;
  local_50 = "int64";
  local_48 = 0x8000000000000000;
  local_40 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
  local_38 = 0x7fffffffffffffff;
  local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
  local_20 = absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_10 = absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,"Value out of range, %d to %d, for %s option \"%s\".",0x31,
             &local_48,4);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}